

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TextureSpecCase::renderTex2D
          (TextureSpecCase *this,Surface *dst,int width,int height)

{
  deUint32 program;
  Context *pCVar1;
  Vector<float,_3> local_4c;
  Vector<float,_3> local_40;
  deUint32 local_34;
  float local_30;
  deUint32 shaderID;
  float h;
  float w;
  int targetH;
  int targetW;
  int height_local;
  int width_local;
  Surface *dst_local;
  TextureSpecCase *this_local;
  
  targetH = height;
  targetW = width;
  _height_local = dst;
  dst_local = (Surface *)this;
  w = (float)sglr::ContextWrapper::getWidth(&this->super_ContextWrapper);
  h = (float)sglr::ContextWrapper::getHeight(&this->super_ContextWrapper);
  shaderID = (deUint32)((float)targetW / (float)(int)w);
  local_30 = (float)targetH / (float)(int)h;
  pCVar1 = sglr::ContextWrapper::getCurrentContext(&this->super_ContextWrapper);
  local_34 = (*pCVar1->_vptr_Context[0x75])(pCVar1,&this->m_tex2DShader);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(&this->super_ContextWrapper);
  Tex2DShader::setUniforms(&this->m_tex2DShader,pCVar1,local_34);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(&this->super_ContextWrapper);
  program = local_34;
  tcu::Vector<float,_3>::Vector(&local_40,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector
            (&local_4c,(float)shaderID + (float)shaderID + -1.0,local_30 + local_30 + -1.0,0.0);
  sglr::drawQuad(pCVar1,program,&local_40,&local_4c);
  readPixels(this,_height_local,0,0,targetW,targetH);
  return;
}

Assistant:

void TextureSpecCase::renderTex2D (tcu::Surface& dst, int width, int height)
{
	int			targetW		= getWidth();
	int			targetH		= getHeight();

	float		w			= (float)width	/ (float)targetW;
	float		h			= (float)height	/ (float)targetH;

	deUint32	shaderID	= getCurrentContext()->createProgram(&m_tex2DShader);

	m_tex2DShader.setUniforms(*getCurrentContext(), shaderID);
	sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f + w*2.0f, -1.0f + h*2.0f, 0.0f));

	// Read pixels back.
	readPixels(dst, 0, 0, width, height);
}